

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O0

bool UnifiedRegex::CaseInsensitive::RangeToEquivClass
               (uint *tblidx,uint l,uint h,uint *acth,codepoint_t *equivl)

{
  bool bVar1;
  codepoint_t *equivl_local;
  uint *acth_local;
  uint h_local;
  uint l_local;
  uint *tblidx_local;
  
  bVar1 = RangeToEquivClass<unsigned_int,UnifiedRegex::CaseInsensitive::RangeToEquivClass(unsigned_int&,unsigned_int,unsigned_int,unsigned_int&,unsigned_int*)::__0>
                    (tblidx,l,h,acth,equivl);
  return bVar1;
}

Assistant:

bool RangeToEquivClass(uint & tblidx, uint l, uint h, uint & acth, __out_ecount(EquivClassSize) codepoint_t equivl[EquivClassSize])
        {
            return RangeToEquivClass(tblidx, l, h, acth, equivl, [](MappingSource source) {
                return source == MappingSource::CaseFolding || source == MappingSource::UnicodeData;
            });
        }